

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_intersection_count(bitset_t *b1,bitset_t *b2)

{
  int iVar1;
  long *in_RSI;
  long *in_RDI;
  size_t k;
  size_t minlength;
  size_t answer;
  ulong local_30;
  ulong local_28;
  size_t local_18;
  
  local_18 = 0;
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    local_30 = in_RDI[1];
  }
  else {
    local_30 = in_RSI[1];
  }
  for (local_28 = 0; local_28 < local_30; local_28 = local_28 + 1) {
    iVar1 = roaring_hamming(*(ulong *)(*in_RDI + local_28 * 8) & *(ulong *)(*in_RSI + local_28 * 8))
    ;
    local_18 = (long)iVar1 + local_18;
  }
  return local_18;
}

Assistant:

size_t bitset_intersection_count(const bitset_t *CROARING_CBITSET_RESTRICT b1,
                                 const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t answer = 0;
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    for (size_t k = 0; k < minlength; ++k) {
        answer += roaring_hamming(b1->array[k] & b2->array[k]);
    }
    return answer;
}